

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O2

int EvpathWaitForCompletion(CP_Services Svcs,void *Handle_v)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  EvpathCompletionHandle Handle;
  int iVar4;
  void *pvVar5;
  
  if (*Handle_v != -1) {
    (*Svcs->verbose)(*(void **)((long)Handle_v + 0x10),5,
                     "Waiting for completion of memory read to rank %d, condition %d\n",
                     (ulong)*(uint *)((long)Handle_v + 0x2c));
    if (*Handle_v != -1) {
      CMCondition_wait(*(undefined8 *)((long)Handle_v + 8));
    }
  }
  if (*(int *)((long)Handle_v + 0x28) == 0) {
    uVar2 = *Handle_v;
    iVar4 = 1;
    if (uVar2 == 0xffffffff) goto LAB_0010e687;
    pvVar5 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    pcVar3 = "Remote memory read to rank %d with condition %d has completed\n";
  }
  else {
    pvVar5 = *(void **)((long)Handle_v + 0x10);
    uVar1 = *(uint *)((long)Handle_v + 0x2c);
    uVar2 = *Handle_v;
    pcVar3 = 
    "Remote memory read to rank %d with condition %d has FAILED because of writer failure\n";
    iVar4 = 0;
  }
  (*Svcs->verbose)(pvVar5,5,pcVar3,(ulong)uVar1,(ulong)uVar2);
LAB_0010e687:
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)Handle_v + 0x18) + 0x18));
  RemoveRequestFromList(*(CP_Services *)((long)Handle_v + 0x18),(Evpath_RS_Stream)Handle_v,Handle);
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)Handle_v + 0x18) + 0x18));
  free(Handle_v);
  return iVar4;
}

Assistant:

static int EvpathWaitForCompletion(CP_Services Svcs, void *Handle_v)
{
    EvpathCompletionHandle Handle = (EvpathCompletionHandle)Handle_v;
    int Ret = 1;
    if (Handle->CMcondition != -1)
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Waiting for completion of memory read to rank %d, condition %d\n",
                      Handle->Rank, Handle->CMcondition);
    /*
     * Wait for the CM condition to be signalled.  If it has been already,
     * this returns immediately.  Copying the incoming data to the waiting
     * buffer has been done by the reply handler.
     */
    if (Handle->CMcondition != -1)
        CMCondition_wait(Handle->cm, Handle->CMcondition);
    if (Handle->Failed)
    {
        Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                      "Remote memory read to rank %d with "
                      "condition %d has FAILED because of "
                      "writer failure\n",
                      Handle->Rank, Handle->CMcondition);
        Ret = 0;
    }
    else
    {
        if (Handle->CMcondition != -1)
            Svcs->verbose(Handle->CPStream, DPTraceVerbose,
                          "Remote memory read to rank %d with condition %d has "
                          "completed\n",
                          Handle->Rank, Handle->CMcondition);
    }
    pthread_mutex_lock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    RemoveRequestFromList(Svcs, Handle->DPStream, Handle);
    pthread_mutex_unlock(&((Evpath_RS_Stream)Handle->DPStream)->DataLock);
    free(Handle);
    return Ret;
}